

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_dist.cpp
# Opt level: O2

Read<int> __thiscall
Omega_h::Dist::exch_reduce<int>(Dist *this,Read<int> *data,Int width,Omega_h_Op op)

{
  undefined4 in_register_00000014;
  void *extraout_RDX;
  Omega_h_Op in_R8D;
  Read<int> RVar1;
  Read<int> item_data;
  Write<int> local_70;
  Write<int> local_60;
  
  Write<int>::Write((Write<int> *)&stack0xffffffffffffffc0,
                    (Write<int> *)CONCAT44(in_register_00000014,width));
  exch<int>((Dist *)&stack0xffffffffffffffb0,data,(Int)(Write<int> *)&stack0xffffffffffffffc0);
  Write<int>::~Write((Write<int> *)&stack0xffffffffffffffc0);
  Write<int>::Write(&local_60,&data[2].write_);
  Write<int>::Write(&local_70,(Write<int> *)&stack0xffffffffffffffb0);
  fan_reduce<int>((Omega_h *)this,(LOs *)&local_60,(Read<int> *)&local_70,op,in_R8D);
  Write<int>::~Write(&local_70);
  Write<int>::~Write(&local_60);
  Write<int>::~Write((Write<int> *)&stack0xffffffffffffffb0);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<T> Dist::exch_reduce(Read<T> data, Int width, Omega_h_Op op) const {
  Read<T> item_data = exch(data, width);
  return fan_reduce(roots2items_[R], item_data, width, op);
}